

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O2

Box __thiscall lunasvg::Element::getGlobalBoundingBox(Element *this)

{
  Box BVar1;
  Box local_40;
  Matrix local_30;
  
  local_40 = getBoundingBox(this);
  getGlobalMatrix(&local_30,this);
  BVar1 = Box::transformed(&local_40,&local_30);
  return BVar1;
}

Assistant:

Box Element::getGlobalBoundingBox() const
{
    return getBoundingBox().transformed(getGlobalMatrix());
}